

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinFoodWeb_kry.c
# Opt level: O1

int PrecSetupBD(N_Vector cc,N_Vector cscale,N_Vector fval,N_Vector fscale,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  sunrealtype *cxy;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  double dVar18;
  double dVar19;
  sunrealtype perturb_rates [6];
  sunrealtype local_68 [7];
  
  dVar1 = *(double *)((long)user_data + 0x438);
  dVar2 = *(double *)((long)user_data + 0x440);
  dVar18 = *(double *)((long)user_data + 0x448);
  dVar3 = *(double *)((long)user_data + 0x450);
  dVar7 = (double)N_VWL2Norm(fval,fscale);
  dVar18 = dVar18 * 1000.0 * dVar7 * 384.0;
  uVar17 = -(ulong)(dVar18 == 0.0);
  lVar12 = 0;
  lVar16 = 0;
  do {
    lVar11 = 0;
    lVar13 = lVar12;
    do {
      lVar9 = *(long *)((long)user_data + lVar16 * 8 + lVar11 * 0x40);
      lVar15 = (lVar16 * 0x30 + lVar11 * 6) * 8;
      cxy = (sunrealtype *)(*(long *)((long)cc->content + 0x10) + lVar15);
      lVar4 = *(long *)((long)cscale->content + 0x10);
      lVar5 = *(long *)(**(long **)((long)user_data + 0x410) + 0x10);
      lVar14 = 0;
      do {
        dVar7 = cxy[lVar14];
        dVar8 = ABS(dVar7) * dVar3;
        dVar19 = (double)(uVar17 & 0x3ff0000000000000 | ~uVar17 & (ulong)dVar18) /
                 *(double *)(lVar15 + lVar4 + lVar14 * 8);
        if (dVar8 <= dVar19) {
          dVar8 = dVar19;
        }
        cxy[lVar14] = dVar7 + dVar8;
        WebRate((double)lVar11 * dVar1,(double)lVar16 * dVar2,cxy,local_68,user_data);
        cxy[lVar14] = dVar7;
        lVar6 = *(long *)(lVar9 + lVar14 * 8);
        lVar10 = 0;
        do {
          *(double *)(lVar6 + lVar10 * 8) =
               (local_68[lVar10] - *(double *)(lVar5 + lVar13 + lVar10 * 8)) * (1.0 / dVar8);
          lVar10 = lVar10 + 1;
        } while (lVar10 != 6);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 6);
      lVar9 = SUNDlsMat_denseGETRF
                        (lVar9,6,6,
                         *(undefined8 *)((long)user_data + lVar16 * 8 + lVar11 * 0x40 + 0x200));
      if (lVar9 != 0) {
        return 1;
      }
      lVar11 = lVar11 + 1;
      lVar13 = lVar13 + 0x30;
    } while (lVar11 != 8);
    lVar16 = lVar16 + 1;
    lVar12 = lVar12 + 0x180;
    if (lVar16 == 8) {
      return 0;
    }
  } while( true );
}

Assistant:

static int PrecSetupBD(N_Vector cc, N_Vector cscale, N_Vector fval,
                       N_Vector fscale, void* user_data)
{
  sunrealtype r, r0, uround, sqruround, xx, yy, delx, dely, csave, fac;
  sunrealtype *cxy, *scxy, **Pxy, *ratesxy, *Pxycol, perturb_rates[NUM_SPECIES];
  sunindextype i, j, jx, jy, ret;
  UserData data;

  data = (UserData)user_data;
  delx = data->dx;
  dely = data->dy;

  uround    = data->uround;
  sqruround = data->sqruround;
  fac       = N_VWL2Norm(fval, fscale);
  r0        = THOUSAND * uround * fac * NEQ;
  if (r0 == ZERO) { r0 = ONE; }

  /* Loop over spatial points; get size NUM_SPECIES Jacobian block at each */
  for (jy = 0; jy < MY; jy++)
  {
    yy = jy * dely;

    for (jx = 0; jx < MX; jx++)
    {
      xx      = jx * delx;
      Pxy     = (data->P)[jx][jy];
      cxy     = IJ_Vptr(cc, jx, jy);
      scxy    = IJ_Vptr(cscale, jx, jy);
      ratesxy = IJ_Vptr((data->rates), jx, jy);

      /* Compute difference quotients of interaction rate fn. */
      for (j = 0; j < NUM_SPECIES; j++)
      {
        csave = cxy[j]; /* Save the j,jx,jy element of cc */
        r     = SUNMAX(sqruround * SUNRabs(csave), r0 / scxy[j]);
        cxy[j] += r; /* Perturb the j,jx,jy element of cc */
        fac = ONE / r;

        WebRate(xx, yy, cxy, perturb_rates, data);

        /* Restore j,jx,jy element of cc */
        cxy[j] = csave;

        /* Load the j-th column of difference quotients */
        Pxycol = Pxy[j];
        for (i = 0; i < NUM_SPECIES; i++)
        {
          Pxycol[i] = (perturb_rates[i] - ratesxy[i]) * fac;
        }

      } /* end of j loop */

      /* Do LU decomposition of size NUM_SPECIES preconditioner block */
      ret = SUNDlsMat_denseGETRF(Pxy, NUM_SPECIES, NUM_SPECIES,
                                 (data->pivot)[jx][jy]);
      if (ret != 0) { return (1); }

    } /* end of jx loop */

  } /* end of jy loop */

  return (0);
}